

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThermoIntegrationForceModifier.cpp
# Opt level: O0

void __thiscall
OpenMD::ThermoIntegrationForceModifier::ThermoIntegrationForceModifier
          (ThermoIntegrationForceModifier *this,SimInfo *info)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *pSVar2;
  Globals *pGVar3;
  undefined8 *in_RDI;
  double dVar4;
  RealType tIntK;
  RealType tIntLambda;
  SimInfo *in_stack_00000d58;
  RestraintForceModifier *in_stack_00000d60;
  double local_30;
  double local_28;
  
  RestraintForceModifier::RestraintForceModifier(in_stack_00000d60,in_stack_00000d58);
  *in_RDI = &PTR__ThermoIntegrationForceModifier_0050c8d0;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
  pSVar2 = SnapshotManager::getCurrentSnapshot(this_00);
  in_RDI[0x18] = pSVar2;
  pGVar3 = SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  in_RDI[0x17] = pGVar3;
  bVar1 = Globals::haveThermodynamicIntegrationLambda((Globals *)0x1b9889);
  if (bVar1) {
    local_28 = Globals::getThermodynamicIntegrationLambda((Globals *)0x1b98aa);
  }
  else {
    local_28 = 1.0;
    snprintf(painCave.errMsg,2000,
             "ThermoIntegration error: the transformation parameter\n\t(lambda) was not specified. OpenMD will use a default\n\tvalue of %f. To set lambda, use the \n\tthermodynamicIntegrationLambda variable.\n"
             ,0x3ff0000000000000);
    painCave.isFatal = 0;
    simError();
  }
  bVar1 = Globals::haveThermodynamicIntegrationK((Globals *)0x1b993a);
  if (bVar1) {
    local_30 = Globals::getThermodynamicIntegrationK((Globals *)0x1b995b);
  }
  else {
    local_30 = 1.0;
    snprintf(painCave.errMsg,2000,
             "ThermoIntegration Warning: the tranformation parameter\n\texponent (k) was not specified. OpenMD will use a default\n\tvalue of %f. To set k, use the thermodynamicIntegrationK\n\tvariable.\n"
             ,0x3ff0000000000000);
    painCave.isFatal = 0;
    simError();
  }
  dVar4 = pow(local_28,local_30);
  in_RDI[0x19] = dVar4;
  return;
}

Assistant:

ThermoIntegrationForceModifier::ThermoIntegrationForceModifier(
      SimInfo* info) :
      RestraintForceModifier {info} {
    currSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    simParam_     = info_->getSimParams();

    RealType tIntLambda, tIntK;

    if (simParam_->haveThermodynamicIntegrationLambda()) {
      tIntLambda = simParam_->getThermodynamicIntegrationLambda();
    } else {
      tIntLambda = 1.0;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ThermoIntegration error: the transformation parameter\n"
               "\t(lambda) was not specified. OpenMD will use a default\n"
               "\tvalue of %f. To set lambda, use the \n"
               "\tthermodynamicIntegrationLambda variable.\n",
               tIntLambda);
      painCave.isFatal = 0;
      simError();
    }

    if (simParam_->haveThermodynamicIntegrationK()) {
      tIntK = simParam_->getThermodynamicIntegrationK();
    } else {
      tIntK = 1.0;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ThermoIntegration Warning: the tranformation parameter\n"
               "\texponent (k) was not specified. OpenMD will use a default\n"
               "\tvalue of %f. To set k, use the thermodynamicIntegrationK\n"
               "\tvariable.\n",
               tIntK);
      painCave.isFatal = 0;
      simError();
    }

    // build the scaling factor used to modulate the forces and torques
    factor_ = pow(tIntLambda, tIntK);
  }